

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsKeyPressed(ImGuiKey key,bool repeat)

{
  float repeat_delay;
  float repeat_rate;
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiKeyData *pIVar5;
  
  pIVar1 = GImGui;
  pIVar5 = GetKeyData(key);
  pIVar2 = GImGui;
  bVar3 = pIVar5->DownDuration == 0.0;
  if (repeat && !bVar3) {
    repeat_delay = (pIVar1->IO).KeyRepeatDelay;
    if (pIVar5->DownDuration <= repeat_delay) {
      bVar3 = false;
    }
    else {
      repeat_rate = (pIVar1->IO).KeyRepeatRate;
      pIVar5 = GetKeyData(key);
      iVar4 = CalcTypematicRepeatAmount
                        (pIVar5->DownDuration - (pIVar2->IO).DeltaTime,pIVar5->DownDuration,
                         repeat_delay,repeat_rate);
      bVar3 = 0 < iVar4;
    }
  }
  return bVar3;
}

Assistant:

bool ImGui::IsKeyPressed(ImGuiKey key, bool repeat)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(key, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}